

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

optional<_khr_df_transfer_e> __thiscall
ktx::OptionsCreate::parseTransferFunction
          (OptionsCreate *this,ParseResult *args,char *argName,char *deprArgName,Reporter *report)

{
  size_t sVar1;
  char *__s;
  int iVar2;
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  const_iterator cVar6;
  ulong uVar7;
  char **args_1;
  ulong uVar8;
  string prefixStr;
  string transferStr;
  undefined1 local_7fb;
  undefined1 local_7fa;
  undefined1 local_7f9;
  char *local_7f8;
  _khr_df_transfer_e local_7ec;
  string local_7e8;
  char *local_7c8;
  char *local_7c0;
  _khr_df_transfer_e local_7b4 [39];
  string local_718;
  string local_6f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_6b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_688;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_660;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_610;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_5e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_5c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_548;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_520;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_4d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_480;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_408;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_3b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_340;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
  local_48;
  
  local_7f8 = argName;
  local_7c0 = deprArgName;
  if ((parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)::
       values_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                                   ::values_abi_cxx11_), iVar2 != 0)) {
    local_7e8._M_dataplus._M_p._0_4_ = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_6d8,(char (*) [5])0x1e2481,(_khr_df_transfer_e *)&local_7e8);
    local_718._M_dataplus._M_p._0_4_ = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_6b0,(char (*) [7])"LINEAR",(_khr_df_transfer_e *)&local_718);
    local_7c8 = (char *)CONCAT44(local_7c8._4_4_,2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_688,(char (*) [5])"SRGB",(_khr_df_transfer_e *)&local_7c8);
    local_7ec = KHR_DF_TRANSFER_SCRGB;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_660,(char (*) [10])"SRGB_EOTF",&local_7ec);
    local_7b4[0x26] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_638,(char (*) [6])"SCRGB",local_7b4 + 0x26);
    local_7b4[0x25] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_610,(char (*) [11])"SCRGB_EOTF",local_7b4 + 0x25);
    local_7b4[0x24] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[4],__khr_df_transfer_e,_true>
              (&local_5e8,(char (*) [4])"ITU",local_7b4 + 0x24);
    local_7b4[0x23] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_5c0,(char (*) [9])"ITU_OETF",local_7b4 + 0x23);
    local_7b4[0x22] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_598,(char (*) [6])"BT601",local_7b4 + 0x22);
    local_7b4[0x21] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_570,(char (*) [11])"BT601_OETF",local_7b4 + 0x21);
    local_7b4[0x20] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_548,(char (*) [6])"BT709",local_7b4 + 0x20);
    local_7b4[0x1f] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_520,(char (*) [11])"BT709_OETF",local_7b4 + 0x1f);
    local_7b4[0x1e] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_4f8,(char (*) [7])"BT2020",local_7b4 + 0x1e);
    local_7b4[0x1d] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_4d0,(char (*) [12])"BT2020_OETF",local_7b4 + 0x1d);
    local_7b4[0x1c] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_4a8,(char (*) [10])"SMPTE170M",local_7b4 + 0x1c);
    local_7b4[0x1b] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[15],__khr_df_transfer_e,_true>
              (&local_480,(char (*) [15])"SMPTE170M_EOTF",local_7b4 + 0x1b);
    local_7b4[0x1a] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[15],__khr_df_transfer_e,_true>
              (&local_458,(char (*) [15])"SMPTE170M_OETF",local_7b4 + 0x1a);
    local_7b4[0x19] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_430,(char (*) [5])"NTSC",local_7b4 + 0x19);
    local_7b4[0x18] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_408,(char (*) [10])"NTSC_EOTF",local_7b4 + 0x18);
    local_7b4[0x17] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[5],__khr_df_transfer_e,_true>
              (&local_3e0,(char (*) [5])"SLOG",local_7b4 + 0x17);
    local_7b4[0x16] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[10],__khr_df_transfer_e,_true>
              (&local_3b8,(char (*) [10])"SLOG_OETF",local_7b4 + 0x16);
    local_7b4[0x15] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_390,(char (*) [6])"SLOG2",local_7b4 + 0x15);
    local_7b4[0x14] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_368,(char (*) [11])"SLOG2_OETF",local_7b4 + 0x14);
    local_7b4[0x13] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_340,(char (*) [7])"BT1886",local_7b4 + 0x13);
    local_7b4[0x12] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_318,(char (*) [12])"BT1886_EOTF",local_7b4 + 0x12);
    local_7b4[0x11] = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_2f0,(char (*) [9])"HLG_OETF",local_7b4 + 0x11);
    local_7b4[0x10] = 9;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_2c8,(char (*) [9])"HLG_EOTF",local_7b4 + 0x10);
    local_7b4[0xf] = 0xb;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              (&local_2a0,(char (*) [8])"PQ_OETF",local_7b4 + 0xf);
    local_7b4[0xe] = 10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              (&local_278,(char (*) [8])"PQ_EOTF",local_7b4 + 0xe);
    local_7b4[0xd] = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_250,(char (*) [6])"DCIP3",local_7b4 + 0xd);
    local_7b4[0xc] = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_228,(char (*) [11])"DCIP3_EOTF",local_7b4 + 0xc);
    local_7b4[0xb] = 0xd;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_200,(char (*) [9])"PAL_OETF",local_7b4 + 0xb);
    local_7b4[10] = 0xe;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_1d8,(char (*) [12])"PAL625_EOTF",local_7b4 + 10);
    local_7b4[9] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[6],__khr_df_transfer_e,_true>
              (&local_1b0,(char (*) [6])"ST240",local_7b4 + 9);
    local_7b4[8] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_188,(char (*) [11])"ST240_EOTF",local_7b4 + 8);
    local_7b4[7] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[11],__khr_df_transfer_e,_true>
              (&local_160,(char (*) [11])"ST240_OETF",local_7b4 + 7);
    local_7b4[6] = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[7],__khr_df_transfer_e,_true>
              (&local_138,(char (*) [7])"ACESCC",local_7b4 + 6);
    local_7b4[5] = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[12],__khr_df_transfer_e,_true>
              (&local_110,(char (*) [12])"ACESCC_OETF",local_7b4 + 5);
    local_7b4[4] = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[8],__khr_df_transfer_e,_true>
              (&local_e8,(char (*) [8])"ACESCCT",local_7b4 + 4);
    local_7b4[3] = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[13],__khr_df_transfer_e,_true>
              (&local_c0,(char (*) [13])"ACESCCT_OETF",local_7b4 + 3);
    local_7b4[2] = 0x12;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[9],__khr_df_transfer_e,_true>
              (&local_98,(char (*) [9])"ADOBERGB",local_7b4 + 2);
    local_7b4[1] = 0x12;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[14],__khr_df_transfer_e,_true>
              (&local_70,(char (*) [14])"ADOBERGB_EOTF",local_7b4 + 1);
    local_7b4[0] = KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>
    ::pair<const_char_(&)[22],__khr_df_transfer_e,_true>
              (&local_48,(char (*) [22])"HLG_UNNORMALIZED_OETF",local_7b4);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_transfer_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_transfer_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,_khr_df_transfer_e>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_transfer_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_transfer_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                   ::values_abi_cxx11_,&local_6d8,&stack0xffffffffffffffe0,0,&local_7f9,&local_7fa,
               &local_7fb);
    lVar5 = 0x690;
    do {
      std::__cxx11::string::~string((string *)((long)&local_6d8.first._M_dataplus._M_p + lVar5));
      lVar5 = lVar5 + -0x28;
    } while (lVar5 != -0x28);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>_>
                 ::~unordered_map,
                 &parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                  ::values_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                         ::values_abi_cxx11_);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,local_7f8,(allocator<char> *)&local_7e8);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_6d8.first);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_6d8);
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,local_7c0,(allocator<char> *)&local_7e8);
    pOVar3 = cxxopts::ParseResult::operator[](args,&local_6d8.first);
    sVar1 = pOVar3->m_count;
    std::__cxx11::string::~string((string *)&local_6d8);
    if (sVar1 == 0) {
      return (_Optional_base<_khr_df_transfer_e,_true,_true>)
             (_Optional_payload<_khr_df_transfer_e,_true,_true,_true>)0x0;
    }
    args_1 = &local_7c0;
    Reporter::warning<char_const(&)[85],char_const*&,char_const*&>
              (report,(char (*) [85])
                      "Option --{} is deprecated and will be removed in the next release. Use --{} instead."
               ,args_1,&local_7f8);
  }
  else {
    args_1 = &local_7f8;
  }
  __s = *args_1;
  if (__s == (char *)0x0) {
    return (_Optional_base<_khr_df_transfer_e,_true,_true>)
           (_Optional_payload<_khr_df_transfer_e,_true,_true,_true>)0x0;
  }
  local_7c8 = __s;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,__s,(allocator<char> *)&local_718);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_7e8);
  pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
  std::__cxx11::string::string((string *)&local_6f8,(string *)pbVar4);
  to_upper_copy(&local_6d8.first,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"KHR_DF_TRANSFER_",(allocator<char> *)&local_718);
  lVar5 = std::__cxx11::string::find((string *)&local_6d8,(ulong)&local_7e8);
  if (lVar5 == 0) {
    std::__cxx11::string::erase
              (&local_6d8,local_6d8.first._M_dataplus._M_p,
               local_6d8.first._M_dataplus._M_p + local_7e8._M_string_length);
  }
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&parseTransferFunction(cxxopts::ParseResult&,char_const*,char_const*,ktx::Reporter&)
                  ::values_abi_cxx11_._M_h,&local_6d8.first);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_718,__s,(allocator<char> *)&local_7ec);
    pOVar3 = cxxopts::ParseResult::operator[](args,&local_718);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    Reporter::fatal_usage<char_const(&)[66],char_const*&,std::__cxx11::string_const&>
              (report,(char (*) [66])
                      "Invalid or unsupported transfer specified as --{} argument: \"{}\".",
               &local_7c8,pbVar4);
    std::__cxx11::string::~string((string *)&local_718);
    uVar8 = 0;
    uVar7 = 0;
  }
  else {
    uVar8 = (ulong)*(uint *)((long)cVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_transfer_e>,_true>
                                   ._M_cur + 0x28);
    uVar7 = 0x100000000;
  }
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_6d8);
  return (_Optional_base<_khr_df_transfer_e,_true,_true>)
         (_Optional_base<_khr_df_transfer_e,_true,_true>)(uVar8 | uVar7);
}

Assistant:

std::optional<khr_df_transfer_e> parseTransferFunction(cxxopts::ParseResult& args,
                                                  const char* argName,
                                                  const char* deprArgName,
                                                  Reporter& report) const {
        // Many of these are aliases of others. To prevent breakage, in the
        // unlikely event one is changed to not be an alias, the aliased
        // enumerator names are used.
        static const std::unordered_map<std::string, khr_df_transfer_e> values{
            { "NONE", KHR_DF_TRANSFER_UNSPECIFIED },
            { "LINEAR", KHR_DF_TRANSFER_LINEAR },
            { "SRGB", KHR_DF_TRANSFER_SRGB },
            { "SRGB_EOTF", KHR_DF_TRANSFER_SRGB_EOTF },  // SRGB
            { "SCRGB", KHR_DF_TRANSFER_SCRGB },          // SRGB
            { "SCRGB_EOTF", KHR_DF_TRANSFER_SRGB_EOTF }, // SRGB
            { "ITU", KHR_DF_TRANSFER_ITU },
            { "ITU_OETF", KHR_DF_TRANSFER_ITU_OETF },     // ITU
            { "BT601", KHR_DF_TRANSFER_BT601_OETF },      // ITU
            { "BT601_OETF", KHR_DF_TRANSFER_BT601_OETF }, // ITU
            { "BT709", KHR_DF_TRANSFER_BT709_OETF },      // ITU
            { "BT709_OETF", KHR_DF_TRANSFER_BT709_OETF }, // ITU
            { "BT2020", KHR_DF_TRANSFER_BT2020_OETF },      // ITU
            { "BT2020_OETF", KHR_DF_TRANSFER_BT2020_OETF }, // ITU
            { "SMPTE170M", KHR_DF_TRANSFER_SMTPE170M },           // ITU
            { "SMPTE170M_EOTF", KHR_DF_TRANSFER_SMTPE170M_EOTF }, // ITU
            { "SMPTE170M_OETF", KHR_DF_TRANSFER_SMTPE170M_OETF }, // ITU
            { "NTSC", KHR_DF_TRANSFER_NTSC },
            { "NTSC_EOTF", KHR_DF_TRANSFER_NTSC_EOTF },  // NTSC
            { "SLOG", KHR_DF_TRANSFER_SLOG },
            { "SLOG_OETF", KHR_DF_TRANSFER_SLOG_OETF }, // SLOG
            { "SLOG2", KHR_DF_TRANSFER_SLOG2 },
            { "SLOG2_OETF", KHR_DF_TRANSFER_SLOG2_OETF }, // SLOG2
            { "BT1886", KHR_DF_TRANSFER_BT1886 },
            { "BT1886_EOTF", KHR_DF_TRANSFER_BT1886_EOTF }, // BT1886
            { "HLG_OETF", KHR_DF_TRANSFER_HLG_OETF },
            { "HLG_EOTF", KHR_DF_TRANSFER_HLG_EOTF },
            { "PQ_OETF", KHR_DF_TRANSFER_PQ_OETF },
            { "PQ_EOTF", KHR_DF_TRANSFER_PQ_EOTF },
            { "DCIP3", KHR_DF_TRANSFER_DCIP3 },
            { "DCIP3_EOTF", KHR_DF_TRANSFER_DCIP3_EOTF }, // DCIP3
            { "PAL_OETF", KHR_DF_TRANSFER_PAL_OETF },
            { "PAL625_EOTF", KHR_DF_TRANSFER_PAL625_EOTF },
            { "ST240", KHR_DF_TRANSFER_ST240 },
            { "ST240_EOTF", KHR_DF_TRANSFER_ST240_EOTF }, // ST240
            { "ST240_OETF", KHR_DF_TRANSFER_ST240_OETF }, // ST240
            { "ACESCC", KHR_DF_TRANSFER_ACESCC },
            { "ACESCC_OETF", KHR_DF_TRANSFER_ACESCC_OETF }, // ACESCC
            { "ACESCCT", KHR_DF_TRANSFER_ACESCCT },
            { "ACESCCT_OETF", KHR_DF_TRANSFER_ACESCCT_OETF }, // ACESCCT
            { "ADOBERGB", KHR_DF_TRANSFER_ADOBERGB },
            { "ADOBERGB_EOTF", KHR_DF_TRANSFER_ADOBERGB_EOTF }, // ADOBERGB
            { "HLG_UNNORMALIZED_OETF", KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF },
        };

        std::optional<khr_df_transfer_e> result = {};
        const char* argNameToUse = nullptr;

        if (args[argName].count()) {
            argNameToUse = argName;
        } else if (args[deprArgName].count()) { // Prefer non-depcrecated name.
            report.warning("Option --{} is deprecated and will be removed in the next release. Use --{} instead.",
                           deprArgName, argName);
            argNameToUse = deprArgName;
        }

        if (argNameToUse) {
            auto transferStr = to_upper_copy(args[argNameToUse].as<std::string>());
            const std::string prefixStr = "KHR_DF_TRANSFER_";
            if (transferStr.find(prefixStr) == 0) {
                transferStr.erase(transferStr.begin(),
                                  transferStr.begin() + prefixStr.size());
            }
            const auto it = values.find(transferStr);
            if (it != values.end()) {
                result = it->second;
            } else {
                report.fatal_usage("Invalid or unsupported transfer specified as --{} argument: \"{}\".",
                                   argNameToUse, args[argNameToUse].as<std::string>());
            }
        }

        return result;
    }